

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

ssize_t correct_reed_solomon_decode_with_erasures
                  (correct_reed_solomon *rs,uint8_t *encoded,size_t encoded_length,
                  uint8_t *erasure_locations,size_t erasure_length,uint8_t *msg)

{
  polynomial_t *ppVar1;
  byte *pbVar2;
  byte bVar3;
  field_logarithm_t *pfVar4;
  field_element_t *pfVar5;
  field_element_t *pfVar6;
  field_logarithm_t *pfVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  polynomial_t res;
  polynomial_t res_00;
  undefined4 uVar18;
  _Bool _Var19;
  uint i_2;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ssize_t sVar23;
  ulong uVar24;
  void *__dest;
  uint uVar25;
  field_element_t fVar26;
  ulong uVar27;
  size_t sVar28;
  size_t __size;
  polynomial_t pVar29;
  polynomial_t polynomial;
  polynomial_t r;
  polynomial_t r_00;
  polynomial_t msgpoly;
  polynomial_t l;
  polynomial_t l_00;
  polynomial_t locator_log;
  polynomial_t temp_poly;
  polynomial_t placeholder_poly;
  
  if (erasure_length == 0) {
    sVar23 = correct_reed_solomon_decode(rs,encoded,encoded_length,msg);
    return sVar23;
  }
  uVar22 = 0xffffffffffffffff;
  uVar27 = rs->block_length - encoded_length;
  if ((encoded_length <= rs->block_length) && (uVar24 = rs->min_distance, erasure_length <= uVar24))
  {
    if (rs->has_init_decode == false) {
      correct_reed_solomon_decoder_create(rs);
    }
    uVar22 = encoded_length - uVar24;
    for (uVar20 = 1; uVar20 - 1 < encoded_length; uVar20 = uVar20 + 1) {
      (rs->received_polynomial).coeff[uVar20 - 1] = encoded[encoded_length - uVar20];
    }
    for (uVar20 = 0; uVar20 < uVar27; uVar20 = uVar20 + 1) {
      (rs->received_polynomial).coeff[encoded_length + uVar20] = '\0';
    }
    for (uVar20 = 0; uVar24 = (ulong)uVar20, uVar24 < erasure_length; uVar20 = uVar20 + 1) {
      rs->error_locations[uVar24] =
           ~(erasure_locations[uVar24] + (char)uVar27) + (char)(int)rs->block_length;
    }
    bVar3 = rs->generator_root_gap;
    pfVar4 = rs->error_locations;
    pfVar5 = rs->error_roots;
    pfVar6 = (rs->field).exp;
    pfVar7 = (rs->field).log;
    for (sVar28 = 0; erasure_length != sVar28; sVar28 = sVar28 + 1) {
      fVar26 = '\0';
      if ((ulong)pfVar6[(ushort)((ushort)pfVar7[pfVar6[pfVar4[sVar28]]] * (ushort)bVar3) % 0xff] !=
          0) {
        fVar26 = pfVar6[((ulong)pfVar7[1] -
                        (ulong)pfVar7[pfVar6[(ushort)((ushort)pfVar7[pfVar6[pfVar4[sVar28]]] *
                                                     (ushort)bVar3) % 0xff]]) + 0xff];
      }
      pfVar5[sVar28] = fVar26;
    }
    uVar8 = (rs->erasure_locator).coeff;
    uVar9 = (rs->erasure_locator).order;
    pVar29.order = uVar9;
    pVar29.coeff = (field_element_t *)uVar8;
    uVar20 = (uint)erasure_length;
    pVar29._12_4_ = 0;
    pVar29 = polynomial_init_from_roots
                       (rs->field,uVar20,rs->error_roots,pVar29,rs->init_from_roots_scratch);
    (rs->erasure_locator).coeff = pVar29.coeff;
    (rs->erasure_locator).order = pVar29.order;
    uVar10 = (rs->received_polynomial).coeff;
    uVar11 = (rs->received_polynomial).order;
    msgpoly.order = uVar11;
    msgpoly.coeff = (field_element_t *)uVar10;
    msgpoly._12_4_ = 0;
    _Var19 = reed_solomon_find_syndromes
                       (rs->field,msgpoly,rs->generator_root_exp,rs->syndromes,rs->min_distance);
    if (_Var19) {
      for (uVar20 = 1; uVar20 - 1 < uVar22; uVar20 = uVar20 + 1) {
        msg[uVar20 - 1] = (rs->received_polynomial).coeff[encoded_length - uVar20];
      }
    }
    else {
      uVar12 = (rs->erasure_locator).coeff;
      uVar13 = (rs->erasure_locator).order;
      l.order = uVar13;
      l.coeff = (field_element_t *)uVar12;
      r.order = (int)rs->min_distance + -1;
      res._12_4_ = temp_poly._12_4_;
      res.order = r.order;
      res.coeff = rs->modified_syndromes;
      r.coeff = rs->syndromes;
      r._12_4_ = 0;
      l._12_4_ = 0;
      polynomial_mul(rs->field,l,r,res);
      __size = rs->min_distance;
      __dest = malloc(__size);
      memcpy(__dest,rs->syndromes,__size);
      for (uVar27 = erasure_length & 0xffffffff; uVar27 < __size; uVar27 = (ulong)((int)uVar27 + 1))
      {
        rs->syndromes[uVar27 - erasure_length] = rs->modified_syndromes[uVar27];
        __size = rs->min_distance;
      }
      uVar21 = reed_solomon_find_error_locator(rs,erasure_length);
      ppVar1 = &rs->error_locator;
      (rs->error_locator).order = uVar21;
      for (uVar25 = 0; uVar25 <= uVar21; uVar25 = uVar25 + 1) {
        (rs->error_locator_log).coeff[uVar25] = (rs->field).log[(rs->error_locator).coeff[uVar25]];
        uVar21 = (rs->error_locator).order;
      }
      (rs->error_locator_log).order = uVar21;
      locator_log.order = uVar21;
      locator_log.coeff = (rs->error_locator_log).coeff;
      locator_log._12_4_ = 0;
      _Var19 = reed_solomon_factorize_error_locator
                         (rs->field,uVar20,locator_log,rs->error_roots,rs->element_exp);
      if (_Var19) {
        pVar29 = polynomial_create((rs->error_locator).order + uVar20);
        uVar16 = (rs->erasure_locator).coeff;
        uVar17 = (rs->erasure_locator).order;
        l_00.order = uVar17;
        l_00.coeff = (field_element_t *)uVar16;
        uVar14 = (rs->error_locator).coeff;
        uVar15 = (rs->error_locator).order;
        r_00.order = uVar15;
        r_00.coeff = (field_element_t *)uVar14;
        res_00._12_4_ = temp_poly._12_4_;
        res_00.order = pVar29.order;
        uVar21 = (uint)pVar29.coeff;
        res_00.coeff = pVar29.coeff;
        r_00._12_4_ = 0;
        l_00._12_4_ = 0;
        polynomial_mul(rs->field,l_00,r_00,res_00);
        pfVar5 = ppVar1->coeff;
        uVar20 = (rs->error_locator).order;
        uVar18 = *(undefined4 *)&(rs->error_locator).field_0xc;
        ppVar1->coeff = pVar29.coeff;
        *(ulong *)&(rs->error_locator).order = CONCAT44(temp_poly._12_4_,pVar29.order);
        reed_solomon_find_error_locations
                  (rs->field,rs->generator_root_gap,rs->error_roots,rs->error_locations,
                   (rs->error_locator).order,uVar21);
        memcpy(rs->syndromes,__dest,rs->min_distance);
        reed_solomon_find_error_values(rs);
        for (uVar27 = 0; uVar27 < (rs->error_locator).order; uVar27 = uVar27 + 1) {
          pbVar2 = (rs->received_polynomial).coeff + rs->error_locations[uVar27];
          *pbVar2 = *pbVar2 ^ rs->error_vals[uVar27];
        }
        ppVar1->coeff = pfVar5;
        (rs->error_locator).order = uVar20;
        *(undefined4 *)&(rs->error_locator).field_0xc = uVar18;
        for (uVar20 = 1; uVar20 - 1 < uVar22; uVar20 = uVar20 + 1) {
          msg[uVar20 - 1] = (rs->received_polynomial).coeff[encoded_length - uVar20];
        }
        polynomial._12_4_ = 0;
        polynomial.coeff = (field_element_t *)SUB128(pVar29._0_12_,0);
        polynomial.order = SUB124(pVar29._0_12_,8);
        polynomial_destroy(polynomial);
        free(__dest);
      }
      else {
        free(__dest);
        uVar22 = 0xffffffffffffffff;
      }
    }
  }
  return uVar22;
}

Assistant:

ssize_t correct_reed_solomon_decode_with_erasures(correct_reed_solomon *rs, const uint8_t *encoded,
                                                  size_t encoded_length, const uint8_t *erasure_locations,
                                                  size_t erasure_length, uint8_t *msg) {
    if (!erasure_length) {
        return correct_reed_solomon_decode(rs, encoded, encoded_length, msg);
    }

    if (encoded_length > rs->block_length) {
        return -1;
    }

    if (erasure_length > rs->min_distance) {
        return -1;
    }

    // the message is the non-remainder part
    size_t msg_length = encoded_length - rs->min_distance;
    // if they handed us a nonfull block, we'll write in 0s
    size_t pad_length = rs->block_length - encoded_length;

    if (!rs->has_init_decode) {
        // initialize rs for decoding
        correct_reed_solomon_decoder_create(rs);
    }

    // we need to copy to our local buffer
    // the buffer we're given has the coordinates in the wrong direction
    // e.g. byte 0 corresponds to the 254th order coefficient
    // so we're going to flip and then write padding
    // the final copied buffer will look like
    // | rem (rs->min_distance) | msg (msg_length) | pad (pad_length) |

    for (unsigned int i = 0; i < encoded_length; i++) {
        rs->received_polynomial.coeff[i] = encoded[encoded_length - (i + 1)];
    }

    // fill the pad_length with 0s
    for (unsigned int i = 0; i < pad_length; i++) {
        rs->received_polynomial.coeff[i + encoded_length] = 0;
    }

    for (unsigned int i = 0; i < erasure_length; i++) {
        // remap the coordinates of the erasures
        rs->error_locations[i] = rs->block_length - (erasure_locations[i] + pad_length + 1);
    }

    reed_solomon_find_error_roots_from_locations(rs->field, rs->generator_root_gap, rs->error_locations,
                                                 rs->error_roots, erasure_length);

    rs->erasure_locator =
        reed_solomon_find_error_locator_from_roots(rs->field, erasure_length, rs->error_roots, rs->erasure_locator, rs->init_from_roots_scratch);

    bool all_zero = reed_solomon_find_syndromes(rs->field, rs->received_polynomial, rs->generator_root_exp,
                                                rs->syndromes, rs->min_distance);

    if (all_zero) {
        // syndromes were all zero, so there was no error in the message
        // copy to msg and we are done
        for (unsigned int i = 0; i < msg_length; i++) {
            msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
        }
        return msg_length;
    }

    reed_solomon_find_modified_syndromes(rs, rs->syndromes, rs->erasure_locator, rs->modified_syndromes);

    field_element_t *syndrome_copy = malloc(rs->min_distance * sizeof(field_element_t));
    memcpy(syndrome_copy, rs->syndromes, rs->min_distance * sizeof(field_element_t));

    for (unsigned int i = erasure_length; i < rs->min_distance; i++) {
        rs->syndromes[i - erasure_length] = rs->modified_syndromes[i];
    }

    unsigned int order = reed_solomon_find_error_locator(rs, erasure_length);
    // XXX fix this vvvv
    rs->error_locator.order = order;

    for (unsigned int i = 0; i <= rs->error_locator.order; i++) {
        // this is a little strange since the coeffs are logs, not elements
        // also, we'll be storing log(0) = 0 for any 0 coeffs in the error locator
        // that would seem bad but we'll just be using this in chien search, and we'll skip all 0 coeffs
        // (you might point out that log(1) also = 0, which would seem to alias. however, that's ok,
        //   because log(1) = 255 as well, and in fact that's how it's represented in our log table)
        rs->error_locator_log.coeff[i] = rs->field.log[rs->error_locator.coeff[i]];
    }
    rs->error_locator_log.order = rs->error_locator.order;

    /*
    for (unsigned int i = 0; i < erasure_length; i++) {
        rs->error_roots[i] = field_div(rs->field, 1, rs->error_roots[i]);
    }
    */

    if (!reed_solomon_factorize_error_locator(rs->field, erasure_length, rs->error_locator_log, rs->error_roots, rs->element_exp)) {
        // roots couldn't be found, so there were too many errors to deal with
        // RS has failed for this message
        free(syndrome_copy);
        return -1;
    }

    polynomial_t temp_poly = polynomial_create(rs->error_locator.order + erasure_length);
    polynomial_mul(rs->field, rs->erasure_locator, rs->error_locator, temp_poly);
    polynomial_t placeholder_poly = rs->error_locator;
    rs->error_locator = temp_poly;

    reed_solomon_find_error_locations(rs->field, rs->generator_root_gap, rs->error_roots, rs->error_locations,
                                      rs->error_locator.order, erasure_length);

    memcpy(rs->syndromes, syndrome_copy, rs->min_distance * sizeof(field_element_t));

    reed_solomon_find_error_values(rs);

    for (unsigned int i = 0; i < rs->error_locator.order; i++) {
        rs->received_polynomial.coeff[rs->error_locations[i]] =
            field_sub(rs->field, rs->received_polynomial.coeff[rs->error_locations[i]], rs->error_vals[i]);
    }

    rs->error_locator = placeholder_poly;

    for (unsigned int i = 0; i < msg_length; i++) {
        msg[i] = rs->received_polynomial.coeff[encoded_length - (i + 1)];
    }

    polynomial_destroy(temp_poly);
    free(syndrome_copy);

    return msg_length;
}